

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiDockNode * ImGui::DockContextAddNode(ImGuiContext_conflict1 *ctx,ImGuiID id)

{
  void *pvVar1;
  ImGuiDockNode *this;
  
  if (id == 0) {
    id = DockContextGenNodeID(ctx);
  }
  else {
    pvVar1 = ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,id);
    if (pvVar1 != (void *)0x0) {
      __assert_fail("DockContextFindNodeByID(ctx, id) == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x32b4,"ImGuiDockNode *ImGui::DockContextAddNode(ImGuiContext *, ImGuiID)");
    }
  }
  this = (ImGuiDockNode *)MemAlloc(0xc0);
  ImGuiDockNode::ImGuiDockNode(this,id);
  ImGuiStorage::SetVoidPtr(&(ctx->DockContext).Nodes,this->ID,this);
  return this;
}

Assistant:

static ImGuiDockNode* ImGui::DockContextAddNode(ImGuiContext* ctx, ImGuiID id)
{
    // Generate an ID for the new node (the exact ID value doesn't matter as long as it is not already used) and add the first window.
    if (id == 0)
        id = DockContextGenNodeID(ctx);
    else
        IM_ASSERT(DockContextFindNodeByID(ctx, id) == NULL);

    // We don't set node->LastFrameAlive on construction. Nodes are always created at all time to reflect .ini settings!
    IMGUI_DEBUG_LOG_DOCKING("DockContextAddNode 0x%08X\n", id);
    ImGuiDockNode* node = IM_NEW(ImGuiDockNode)(id);
    ctx->DockContext.Nodes.SetVoidPtr(node->ID, node);
    return node;
}